

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_command_runner.cc
# Opt level: O3

void __thiscall
PosixCommandRunner::RunCommand
          (PosixCommandRunner *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command)

{
  pointer pbVar1;
  int iVar2;
  string *arg;
  pointer pbVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<char_*,_std::allocator<char_*>_> args;
  char **local_58;
  iterator iStack_50;
  char **local_48;
  char *local_38;
  
  if (this->current_process_ != -1) {
    __assert_fail("current_process_ == -1 && \"Previous command is still running\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/posix_command_runner.cc"
                  ,0x2f,
                  "virtual void PosixCommandRunner::RunCommand(const std::vector<std::string> &)");
  }
  local_58 = (char **)0x0;
  iStack_50._M_current = (char **)0x0;
  local_48 = (char **)0x0;
  pbVar3 = (command->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (command->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    do {
      local_38 = (pbVar3->_M_dataplus)._M_p;
      if (iStack_50._M_current == local_48) {
        std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*>
                  ((vector<char*,std::allocator<char*>> *)&local_58,iStack_50,&local_38);
      }
      else {
        *iStack_50._M_current = local_38;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
    local_38 = (char *)0x0;
    if (iStack_50._M_current != local_48) {
      *iStack_50._M_current = (char *)0x0;
      iStack_50._M_current = iStack_50._M_current + 1;
      goto LAB_0012827a;
    }
  }
  local_38 = (char *)0x0;
  std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*>
            ((vector<char*,std::allocator<char*>> *)&local_58,iStack_50,&local_38);
LAB_0012827a:
  iVar2 = posix_spawnp(&this->current_process_,
                       (((command->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                       (posix_spawn_file_actions_t *)0x0,(posix_spawnattr_t *)0x0,local_58,_environ)
  ;
  if (iVar2 != 0) {
    this->current_process_ = -1;
    this->previous_command_failed_ = true;
  }
  this->previous_command_failed_ = false;
  if (local_58 != (char **)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return;
}

Assistant:

void PosixCommandRunner::RunCommand(const std::vector<std::string>& command) {
  assert(current_process_ == -1 && "Previous command is still running");

  // Convert argument strings to char *, as expected by posix_spawnp().
  std::vector<char*> args;
  for (const std::string& arg : command)
    args.push_back(const_cast<char*>(arg.c_str()));
  args.push_back(nullptr);

  // Spawn subprocess.
  if (posix_spawnp(&current_process_, command[0].c_str(), nullptr, nullptr,
                   args.data(), environ) != 0) {
    current_process_ = -1;
    previous_command_failed_ = true;
  }
  previous_command_failed_ = false;
}